

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv6Transmitter::AddLoopbackAddress(RTPUDPv6Transmitter *this)

{
  bool bVar1;
  reference ip1;
  bool local_51;
  iterator local_40;
  _List_const_iterator<in6_addr> local_38;
  iterator local_30;
  _List_const_iterator<in6_addr> local_28;
  byte local_19;
  _List_const_iterator<in6_addr> _Stack_18;
  bool found;
  const_iterator it;
  RTPUDPv6Transmitter *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_const_iterator<in6_addr>::_List_const_iterator(&stack0xffffffffffffffe8);
  local_19 = 0;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::begin(&this->localIPs);
  std::_List_const_iterator<in6_addr>::_List_const_iterator(&local_28,&local_30);
  _Stack_18._M_node = local_28._M_node;
  while( true ) {
    local_51 = false;
    if ((local_19 & 1) == 0) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::end(&this->localIPs);
      std::_List_const_iterator<in6_addr>::_List_const_iterator(&local_38,&local_40);
      local_51 = std::operator!=(&stack0xffffffffffffffe8,&local_38);
    }
    if (local_51 == false) break;
    ip1 = std::_List_const_iterator<in6_addr>::operator*(&stack0xffffffffffffffe8);
    bVar1 = operator==(ip1,(in6_addr *)&in6addr_loopback);
    if (bVar1) {
      local_19 = 1;
    }
    std::_List_const_iterator<in6_addr>::operator++(&stack0xffffffffffffffe8,0);
  }
  if ((local_19 & 1) == 0) {
    std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::push_back
              (&this->localIPs,(value_type *)&in6addr_loopback);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::AddLoopbackAddress()
{
	std::list<in6_addr>::const_iterator it;
	bool found = false;

	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if ((*it) == in6addr_loopback)
			found = true;
	}

	if (!found)
		localIPs.push_back(in6addr_loopback);
}